

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aln_filter.cpp
# Opt level: O1

alns_t * example::filter_to_unique_cds_for_gene
                   (alns_t *__return_storage_ptr__,alns_t *alns_for_gene)

{
  seq_id_t *psVar1;
  pointer paVar2;
  __normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
  __seed;
  __normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
  __last;
  value_type *__v;
  pos_t pVar3;
  pos_t pVar4;
  int64_t iVar5;
  pointer pvVar6;
  pointer __last_00;
  alns_t *paVar7;
  bool bVar8;
  pointer paVar9;
  long lVar10;
  pointer paVar11;
  value_type *__v_00;
  size_type *__v_01;
  iterator __first;
  _Head_base<2UL,_long_&,_false> _Var12;
  undefined1 local_1b9;
  undefined1 local_1b8 [16];
  aln_t *local_1a8;
  undefined1 local_198 [16];
  pointer paStack_188;
  concat local_179;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_178;
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  local_158;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_138;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_118;
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  local_f8;
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  *local_e0;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_d8;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_b8;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_98;
  vector<example::aln_t,_std::allocator<example::aln_t>_> local_78;
  alns_t *local_58;
  value_type *local_50;
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  local_48;
  
  paVar11 = (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>).
            _M_impl.super__Vector_impl_data._M_start;
  paVar2 = (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar10 = (long)paVar2 - (long)paVar11 >> 9;
  paVar9 = paVar11;
  if (0 < lVar10) {
    paVar9 = (pointer)((long)&paVar11->aln_id + ((long)paVar2 - (long)paVar11 & 0xfffffffffffffe00U)
                      );
    lVar10 = lVar10 + 1;
    __first._M_current = paVar11 + 2;
    do {
      if (__first._M_current[-2].chr_cds_start_pos == 0) {
        __first._M_current = __first._M_current + -2;
        goto LAB_0010fc8c;
      }
      if (__first._M_current[-1].chr_cds_start_pos == 0) {
        __first._M_current = __first._M_current + -1;
        goto LAB_0010fc8c;
      }
      if ((__first._M_current)->chr_cds_start_pos == 0) goto LAB_0010fc8c;
      if (__first._M_current[1].chr_cds_start_pos == 0) {
        __first._M_current = __first._M_current + 1;
        goto LAB_0010fc8c;
      }
      lVar10 = lVar10 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar10);
  }
  lVar10 = (long)paVar2 - (long)paVar9 >> 7;
  if (lVar10 != 1) {
    if (lVar10 != 2) {
      __first._M_current = paVar2;
      if ((lVar10 != 3) || (__first._M_current = paVar9, paVar9->chr_cds_start_pos == 0))
      goto LAB_0010fc8c;
      paVar9 = paVar9 + 1;
    }
    __first._M_current = paVar9;
    if (paVar9->chr_cds_start_pos == 0) goto LAB_0010fc8c;
    paVar9 = paVar9 + 1;
  }
  __first._M_current = paVar9;
  if (paVar9->chr_cds_start_pos != 0) {
    __first._M_current = paVar2;
  }
LAB_0010fc8c:
  paVar11 = __first._M_current + 1;
  local_58 = __return_storage_ptr__;
  if (paVar11 != paVar2 && __first._M_current != paVar2) {
    do {
      if (paVar11->chr_cds_start_pos != 0) {
        (__first._M_current)->gene_id = paVar11->gene_id;
        (__first._M_current)->aln_id = paVar11->aln_id;
        std::__cxx11::string::operator=
                  ((string *)&(__first._M_current)->mrna_id,(string *)&paVar11->mrna_id);
        ((__first._M_current)->mrna_id).second = (paVar11->mrna_id).second;
        std::__cxx11::string::operator=
                  ((string *)&(__first._M_current)->chr_id,(string *)&paVar11->chr_id);
        ((__first._M_current)->chr_id).second = (paVar11->chr_id).second;
        pVar3 = paVar11->chr_start;
        pVar4 = paVar11->chr_stop;
        iVar5 = paVar11->score;
        (__first._M_current)->chr_cds_start_pos = paVar11->chr_cds_start_pos;
        (__first._M_current)->score = iVar5;
        (__first._M_current)->chr_start = pVar3;
        (__first._M_current)->chr_stop = pVar4;
        __first._M_current = __first._M_current + 1;
      }
      paVar11 = paVar11 + 1;
    } while (paVar11 != paVar2);
  }
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::_M_erase
            (alns_for_gene,__first,
             (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  __seed._M_current =
       (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  paStack_188 = (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (alns_for_gene->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198._0_8_ = __seed._M_current;
  local_198._8_8_ = __last._M_current;
  if (__seed._M_current != __last._M_current) {
    lVar10 = (long)__last._M_current - (long)__seed._M_current >> 7;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
    ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
                         *)local_1b8,__seed,(lVar10 - (lVar10 + 1 >> 0x3f)) + 1 >> 1);
    if (local_1a8 == (aln_t *)0x0) {
      std::operator()(__seed,__last,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                       )0x0);
    }
    else {
      std::operator()(__seed,__last,local_1a8,local_1b8._8_8_,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                       )&local_158);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
    ::~_Temporary_buffer
              ((_Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
                *)local_1b8);
  }
  local_138.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_198._0_8_;
  local_138.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_198._8_8_;
  local_138.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = paStack_188;
  local_198._0_8_ = (long *)0x0;
  local_198._8_8_ = (pointer)0x0;
  paStack_188 = (pointer)0x0;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_198);
  paVar11 = local_138.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
            super__Vector_impl_data._M_finish;
  __v = local_138.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_198._0_8_ =
       local_138.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_198._8_8_ =
       local_138.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  paStack_188 = local_138.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_138.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (vector<example::aln_t,_std::allocator<example::aln_t>_> *)0x0;
  local_f8.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (vector<example::aln_t,_std::allocator<example::aln_t>_> *)0x0;
  local_f8.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (__v != paVar11) {
    local_1b8._0_8_ = (long *)0x0;
    local_1b8._8_8_ = (pointer)0x0;
    local_1a8 = (aln_t *)0x0;
    std::
    vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
    ::emplace_back<std::vector<example::aln_t,std::allocator<example::aln_t>>>
              ((vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
                *)&local_f8,(vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_1b8);
    std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
              ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_1b8);
    std::vector<example::aln_t,_std::allocator<example::aln_t>_>::_M_insert_rval
              (local_f8.
               super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,
               local_f8.
               super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
               super__Vector_impl_data._M_finish,__v);
    while (__v_00 = __v + 1, __v_00 != paVar11) {
      if (local_f8.
          super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].
          super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].chr_cds_start_pos != __v[1].chr_cds_start_pos) {
        local_1b8._0_8_ = (long *)0x0;
        local_1b8._8_8_ = (pointer)0x0;
        local_1a8 = (aln_t *)0x0;
        std::
        vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
        ::emplace_back<std::vector<example::aln_t,std::allocator<example::aln_t>>>
                  ((vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
                    *)&local_f8,(vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_1b8
                  );
        std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
                  ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_1b8);
      }
      std::vector<example::aln_t,_std::allocator<example::aln_t>_>::_M_insert_rval
                (local_f8.
                 super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,
                 local_f8.
                 super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
                 super__Vector_impl_data._M_finish,__v_00);
      __v = __v_00;
    }
  }
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_198);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_138);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_178);
  paStack_188 = (pointer)local_f8.
                         super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __last_00 = local_f8.
              super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  pvVar6 = local_f8.
           super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f8.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198._0_8_ = pvVar6;
  local_198._8_8_ = __last_00;
  local_118.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pvVar6 != __last_00) {
    lVar10 = ((long)__last_00 - (long)pvVar6 >> 3) * -0x5555555555555555;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
    ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                         *)local_1b8,
                        (__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
                         )pvVar6,(lVar10 - (lVar10 + 1 >> 0x3f)) + 1 >> 1);
    if (local_1a8 == (aln_t *)0x0) {
      std::operator()((__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
                       )pvVar6,(__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
                                )__last_00,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                       )0x0);
    }
    else {
      std::operator()((__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
                       )pvVar6,(__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>
                                )__last_00,
                      (vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_1a8,
                      local_1b8._8_8_,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                       )&local_d8);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
    ::~_Temporary_buffer
              ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_*,_std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                *)local_1b8);
  }
  local_158.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_198._0_8_;
  local_158.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_198._8_8_;
  local_158.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paStack_188;
  local_198._0_8_ = (long *)0x0;
  local_198._8_8_ = (pointer)0x0;
  paStack_188 = (pointer)0x0;
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
             *)local_198);
  pvVar6 = local_158.
           super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  paVar11 = (pointer)local_158.
                     super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  local_198._0_8_ =
       local_158.
       super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_198._8_8_ =
       local_158.
       super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  paStack_188 = (pointer)local_158.
                         super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_158.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (paVar11 != (pointer)pvVar6) {
    local_1b8._0_8_ = (long *)0x0;
    local_1b8._8_8_ = (pointer)0x0;
    local_1a8 = (aln_t *)0x0;
    std::
    vector<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>,std::allocator<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>>
    ::
    emplace_back<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>
              ((vector<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>,std::allocator<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>>
                *)&local_178,
               (vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                *)local_1b8);
    std::
    vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
    ::~vector((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
               *)local_1b8);
    std::
    vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
    ::_M_insert_rval((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                      *)&local_178.
                         super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl
                         .super__Vector_impl_data._M_finish[-1].chr_stop,
                     (vector<example::aln_t,_std::allocator<example::aln_t>_> *)
                     local_178.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1].chr_cds_start_pos,
                     (value_type *)paVar11);
    while (__v_01 = &(paVar11->mrna_id).first._M_string_length, (pointer)__v_01 != pvVar6) {
      if ((paVar11->mrna_id).first.field_2._M_allocated_capacity - *__v_01 !=
          *(long *)(local_178.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1].chr_cds_start_pos + -0x10) -
          *(long *)(local_178.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1].chr_cds_start_pos + -0x18)) {
        local_1b8._0_8_ = (long *)0x0;
        local_1b8._8_8_ = (pointer)0x0;
        local_1a8 = (aln_t *)0x0;
        std::
        vector<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>,std::allocator<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>>
        ::
        emplace_back<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>
                  ((vector<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>,std::allocator<std::vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>>>
                    *)&local_178,
                   (vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                    *)local_1b8);
        std::
        vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
        ::~vector((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                   *)local_1b8);
      }
      std::
      vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
      ::_M_insert_rval((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                        *)&local_178.
                           super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>.
                           _M_impl.super__Vector_impl_data._M_finish[-1].chr_stop,
                       (vector<example::aln_t,_std::allocator<example::aln_t>_> *)
                       local_178.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].chr_cds_start_pos,
                       (value_type *)__v_01);
      paVar11 = (pointer)__v_01;
    }
  }
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
             *)local_198);
  local_1b8._0_8_ = (long *)0x1;
  local_1b8._8_8_ = (pointer)0x0;
  rangeless::fn::operators::operator%
            ((vector<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>,_std::allocator<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
              *)&local_138,
             (vector<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>,_std::allocator<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
              *)&local_178,(take_while<rangeless::fn::impl::call_count_lt> *)local_1b8);
  rangeless::fn::operators::operator%
            (&local_48,
             (vector<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>,_std::allocator<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
              *)&local_138,(concat *)local_198);
  std::
  vector<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>,_std::allocator<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>,_std::allocator<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
             *)&local_138);
  std::
  vector<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>,_std::allocator<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>,_std::allocator<std::vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>_>_>
             *)&local_178);
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector(&local_158);
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
             *)&local_118);
  local_e0 = &local_48;
  rangeless::fn::operators::operator%(&local_b8,local_e0,&local_179);
  paStack_188 = local_b8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage;
  paVar2 = local_b8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  paVar11 = local_b8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_b8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198._0_8_ = paVar11;
  local_198._8_8_ = paVar2;
  local_d8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (paVar11 != paVar2) {
    lVar10 = (long)paVar2 - (long)paVar11 >> 7;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
    ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
                         *)local_1b8,
                        (__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                         )paVar11,(lVar10 - (lVar10 + 1 >> 0x3f)) + 1 >> 1);
    if (local_1a8 == (aln_t *)0x0) {
      std::operator()((__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                       )paVar11,
                      (__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                       )paVar2,(_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                                )&local_1b9);
    }
    else {
      std::operator()((__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                       )paVar11,
                      (__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                       )paVar2,local_1a8,local_1b8._8_8_,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                       )&local_1b9);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
    ::~_Temporary_buffer
              ((_Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
                *)local_1b8);
  }
  local_118.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_198._0_8_;
  local_118.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_198._8_8_;
  local_118.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = paStack_188;
  local_198._0_8_ = (long *)0x0;
  local_198._8_8_ = (pointer)0x0;
  paStack_188 = (pointer)0x0;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_198);
  local_50 = local_118.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
             super__Vector_impl_data._M_finish;
  paVar11 = local_118.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_138.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_118.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_138.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_118.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_138.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_118.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_118.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (paVar11 != local_50) {
    local_1b8._0_8_ = (long *)0x0;
    local_1b8._8_8_ = (pointer)0x0;
    local_1a8 = (aln_t *)0x0;
    std::
    vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
    ::emplace_back<std::vector<example::aln_t,std::allocator<example::aln_t>>>
              ((vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
                *)&local_158,(vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_1b8);
    std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
              ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_1b8);
    std::vector<example::aln_t,_std::allocator<example::aln_t>_>::_M_insert_rval
              (local_158.
               super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,
               local_158.
               super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
               super__Vector_impl_data._M_finish,paVar11);
    for (_Var12._M_head_impl = &paVar11[1].chr_cds_start_pos;
        (value_type *)(_Var12._M_head_impl + -0xe) != local_50;
        _Var12._M_head_impl = _Var12._M_head_impl + 0x10) {
      paVar11 = local_158.
                super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
                super__Vector_impl_data._M_finish;
      psVar1 = &paVar11[-1].chr_id;
      lVar10 = std::__cxx11::string::find((char *)psVar1,0x121403,0);
      local_1b8._0_8_ = &paVar11[-1].chr_cds_start_pos;
      local_1a8 = (aln_t *)CONCAT71(local_1a8._1_7_,lVar10 != 0);
      paVar11 = (pointer)(_Var12._M_head_impl + -7);
      local_1b8._8_8_ = psVar1;
      lVar10 = std::__cxx11::string::find((char *)paVar11,0x121403,0);
      paStack_188 = (pointer)CONCAT71(paStack_188._1_7_,lVar10 != 0);
      local_198._0_8_ = _Var12._M_head_impl;
      local_198._8_8_ = paVar11;
      if ((local_1a8._0_1_ != (lVar10 != 0)) ||
         (bVar8 = std::
                  __tuple_compare<std::tuple<bool,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_&,_long_&>,_std::tuple<bool,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_&,_long_&>,_1UL,_3UL>
                  ::__eq((tuple<bool,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_&,_long_&>
                          *)local_1b8,
                         (tuple<bool,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_&,_long_&>
                          *)local_198), !bVar8)) {
        local_1b8._0_8_ = (long *)0x0;
        local_1b8._8_8_ = (pointer)0x0;
        local_1a8 = (aln_t *)0x0;
        std::
        vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
        ::emplace_back<std::vector<example::aln_t,std::allocator<example::aln_t>>>
                  ((vector<std::vector<example::aln_t,std::allocator<example::aln_t>>,std::allocator<std::vector<example::aln_t,std::allocator<example::aln_t>>>>
                    *)&local_158,
                   (vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_1b8);
        std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
                  ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_1b8);
      }
      std::vector<example::aln_t,_std::allocator<example::aln_t>_>::_M_insert_rval
                (local_158.
                 super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,
                 local_158.
                 super__Vector_base<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
                 super__Vector_impl_data._M_finish,(value_type *)(_Var12._M_head_impl + -0xe));
    }
  }
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_138);
  local_1b8._0_8_ = (long *)0x1;
  local_1b8._8_8_ = (pointer)0x0;
  rangeless::fn::operators::operator%
            ((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
              *)&local_178,&local_158,(take_while<rangeless::fn::impl::call_count_lt> *)local_1b8);
  rangeless::fn::operators::operator%
            (&local_78,
             (vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
              *)&local_178,(concat *)local_198);
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector((vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
             *)&local_178);
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector(&local_158);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_118);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_d8);
  paVar2 = local_78.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  paVar11 = local_78.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_198._0_8_ =
       local_78.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_198._8_8_ =
       local_78.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  paStack_188 = local_78.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage;
  local_78.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (paVar11 != paVar2) {
    lVar10 = (long)paVar2 - (long)paVar11 >> 7;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
    ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
                         *)local_1b8,
                        (__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                         )paVar11,(lVar10 - (lVar10 + 1 >> 0x3f)) + 1 >> 1);
    if (local_1a8 == (aln_t *)0x0) {
      std::operator()((__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                       )paVar11,
                      (__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                       )paVar2,(_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                                )&local_138);
    }
    else {
      std::operator()((__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                       )paVar11,
                      (__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>
                       )paVar2,local_1a8,local_1b8._8_8_,
                      (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2504:21)>
                       )&local_138);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
    ::~_Temporary_buffer
              ((_Temporary_buffer<__gnu_cxx::__normal_iterator<example::aln_t_*,_std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>,_example::aln_t>
                *)local_1b8);
  }
  paVar7 = local_58;
  (local_58->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_198._0_8_;
  (local_58->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_198._8_8_;
  (local_58->super__Vector_base<example::aln_t,_std::allocator<example::aln_t>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = paStack_188;
  local_198._0_8_ = (long *)0x0;
  local_198._8_8_ = (pointer)0x0;
  paStack_188 = (pointer)0x0;
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector
            ((vector<example::aln_t,_std::allocator<example::aln_t>_> *)local_198);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_78);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_b8);
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::vector<example::aln_t,_std::allocator<example::aln_t>_>,_std::allocator<std::vector<example::aln_t,_std::allocator<example::aln_t>_>_>_>
  ::~vector(&local_f8);
  std::vector<example::aln_t,_std::allocator<example::aln_t>_>::~vector(&local_98);
  return paVar7;
}

Assistant:

static auto filter_to_unique_cds_for_gene(alns_t alns_for_gene) -> alns_t
{
    return std::move(alns_for_gene)

    // (5.1) Keep alignments with valid cds-start.

  % fn::where L( _.chr_cds_start_pos != aln_t::invalid_pos )

    //-------------------------------------------------------------------
    // (5.2) Keep alignments with most-ubiquitous valid cds-starts.

  % my::group_all_by L( _.chr_cds_start_pos )
  % my::where_max_by L( _.size() )
  % fn::concat()

    //-------------------------------------------------------------------
    // Filter to unique chr_cds_start_pos.
    // (5.3) Prefer on "NC_*" chr-accession,
    // (5.4) then lower chr-id, 
    // (5.5) then more upstream cds-start.

  % my::where_min_by L( fn::tie_lvals( _.chr_id.first.find("NC_") != 0, 
                                       _.chr_id, 
                                       _.chr_cds_start_pos))

#if 1
    //-------------------------------------------------------------------
    // (6) Sort by decreasing alignment score, then by increasing mrna-id.

  % fn::sort_by L( fn::tie_lvals( fn::by::decreasing( _.score), _.mrna_id))

#else // alternatively, e.g if you want to use your own sort

  % [](alns_t alns)
    {
        gfx::timsort(
            alns.begin(), alns.end(), 
            fn::by::make_comp([](const aln_t& a)
            {
                return std::make_pair(
                   fn::by::decreasing( a.score),
                            std::cref( a.mrna_id));
            });
        return std::move(alns);
    }
#endif
    ; // end of return-statement
}